

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::AssertHelper::~AssertHelper(AssertHelper *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AssertHelperData *ptr;
  pointer ptr_00;
  
  ptr = this->data_;
  if (ptr != (AssertHelperData *)0x0) {
    ptr_00 = (ptr->message)._M_dataplus._M_p;
    paVar1 = &(ptr->message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ptr_00 != paVar1) {
      operator_delete(ptr_00,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(ptr,0x38);
  return;
}

Assistant:

AssertHelper::~AssertHelper() { delete data_; }